

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_len.c
# Opt level: O2

uint str_len(char *s)

{
  char *pcVar1;
  char *t;
  
  pcVar1 = s + 3;
  do {
    if (pcVar1[-3] == '\0') {
      pcVar1 = pcVar1 + -3;
LAB_00102d20:
      return (int)pcVar1 - (int)s;
    }
    if (pcVar1[-2] == '\0') {
      pcVar1 = pcVar1 + -2;
      goto LAB_00102d20;
    }
    if (pcVar1[-1] == '\0') {
      pcVar1 = pcVar1 + -1;
      goto LAB_00102d20;
    }
    if (*pcVar1 == '\0') goto LAB_00102d20;
    pcVar1 = pcVar1 + 4;
  } while( true );
}

Assistant:

unsigned int str_len(const char *s)
{
  register const char *t;

  t = s;
  for (;;) {
    if (!*t) return t - s; ++t;
    if (!*t) return t - s; ++t;
    if (!*t) return t - s; ++t;
    if (!*t) return t - s; ++t;
  }
}